

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O0

void dill_mark_branch_location(dill_stream_conflict s,int label)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  undefined4 in_ESI;
  long in_RDI;
  int branch_loc;
  branch_table *t;
  size_t in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_RDI + 8);
  iVar2 = (int)*(undefined8 *)(*(long *)(in_RDI + 8) + 8) - (int)**(undefined8 **)(in_RDI + 8);
  if (*(int *)(lVar1 + 0x40) == *(int *)(lVar1 + 0x44)) {
    *(int *)(lVar1 + 0x44) = *(int *)(lVar1 + 0x44) + 1;
    pvVar3 = dill_realloc((void *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                          in_stack_ffffffffffffffd8);
    *(void **)(lVar1 + 0x48) = pvVar3;
  }
  *(undefined4 *)(*(long *)(lVar1 + 0x48) + (long)*(int *)(lVar1 + 0x40) * 8) = in_ESI;
  *(int *)(*(long *)(lVar1 + 0x48) + 4 + (long)*(int *)(lVar1 + 0x40) * 8) = iVar2;
  *(int *)(lVar1 + 0x40) = *(int *)(lVar1 + 0x40) + 1;
  return;
}

Assistant:

extern void
dill_mark_branch_location(dill_stream s, int label)
{
    struct branch_table* t = &s->p->branch_table;
    int branch_loc = (int)((char*)s->p->cur_ip - (char*)s->p->code_base);

    if (t->branch_count == t->branch_alloc) {
        t->branch_alloc++;
        t->branch_locs = realloc(
            t->branch_locs, sizeof(struct branch_location) * t->branch_alloc);
    }
    t->branch_locs[t->branch_count].label = label;
    t->branch_locs[t->branch_count].loc = branch_loc;
    t->branch_count++;
}